

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

void CSound::RateConvert(int SampleID)

{
  int iVar1;
  short *psVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  short *psVar6;
  uint uVar7;
  ulong uVar8;
  CSample *pCVar9;
  float fVar10;
  
  if (m_aSamples[SampleID].m_pData != (short *)0x0) {
    pCVar9 = m_aSamples + SampleID;
    if (m_aSamples[SampleID].m_Rate != m_MixingRate) {
      fVar10 = (float)m_MixingRate *
               ((float)m_aSamples[SampleID].m_NumFrames / (float)m_aSamples[SampleID].m_Rate);
      uVar7 = (uint)fVar10;
      psVar2 = (short *)mem_alloc(m_aSamples[SampleID].m_Channels * uVar7 * 2);
      uVar3 = 0;
      uVar4 = 0;
      if (0 < (int)uVar7) {
        uVar4 = (ulong)uVar7;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        iVar1 = m_aSamples[SampleID].m_NumFrames;
        iVar5 = (int)((float)iVar1 * ((float)(int)uVar3 / (float)(int)fVar10));
        if (iVar1 <= iVar5) {
          iVar5 = iVar1 + -1;
        }
        if (m_aSamples[SampleID].m_Channels == 2) {
          psVar6 = pCVar9->m_pData;
          psVar2[uVar3 * 2] = psVar6[iVar5 * 2];
          psVar6 = psVar6 + (iVar5 * 2 + 1);
          uVar8 = uVar3 * 2 + 1;
LAB_001266c7:
          psVar2[uVar8] = *psVar6;
        }
        else if (m_aSamples[SampleID].m_Channels == 1) {
          psVar6 = pCVar9->m_pData + iVar5;
          uVar8 = uVar3;
          goto LAB_001266c7;
        }
      }
      mem_free(pCVar9->m_pData);
      pCVar9->m_pData = psVar2;
      m_aSamples[SampleID].m_NumFrames = uVar7;
    }
  }
  return;
}

Assistant:

void CSound::RateConvert(int SampleID)
{
	CSample *pSample = &m_aSamples[SampleID];
	int NumFrames = 0;
	short *pNewData = 0;

	// make sure that we need to convert this sound
	if(!pSample->m_pData || pSample->m_Rate == m_MixingRate)
		return;

	// allocate new data
	NumFrames = (int)((pSample->m_NumFrames/(float)pSample->m_Rate)*m_MixingRate);
	pNewData = (short *)mem_alloc(NumFrames*pSample->m_Channels*sizeof(short));

	for(int i = 0; i < NumFrames; i++)
	{
		// resample TODO: this should be done better, like linear at least
		float a = i/(float)NumFrames;
		int f = (int)(a*pSample->m_NumFrames);
		if(f >= pSample->m_NumFrames)
			f = pSample->m_NumFrames-1;

		// set new data
		if(pSample->m_Channels == 1)
			pNewData[i] = pSample->m_pData[f];
		else if(pSample->m_Channels == 2)
		{
			pNewData[i*2] = pSample->m_pData[f*2];
			pNewData[i*2+1] = pSample->m_pData[f*2+1];
		}
	}

	// free old data and apply new
	mem_free(pSample->m_pData);
	pSample->m_pData = pNewData;
	pSample->m_NumFrames = NumFrames;
}